

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

bool __thiscall QProcessEnvironment::contains(QProcessEnvironment *this,QString *name)

{
  QProcessEnvironmentPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (this_00 == (QProcessEnvironmentPrivate *)0x0) {
    bVar1 = false;
  }
  else {
    QProcessEnvironmentPrivate::prepareName((Key *)&local_30,this_00,name);
    bVar1 = QMap<QByteArray,_QProcEnvValue>::contains(&this_00->vars,(QByteArray *)&local_30);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessEnvironment::contains(const QString &name) const
{
    if (!d)
        return false;
    return d->vars.contains(d->prepareName(name));
}